

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall
test_conv_transpose_1d::build_graph(test_conv_transpose_1d *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  
  pgVar1 = test_case::ggml_new_tensor
                     (&this->super_test_case,ctx,GGML_TYPE_F32,4,(this->ne_input)._M_elems);
  ggml_set_name(pgVar1,"input");
  pgVar2 = test_case::ggml_new_tensor
                     (&this->super_test_case,ctx,GGML_TYPE_F32,4,(this->ne_kernel)._M_elems);
  ggml_set_name(pgVar2,"kernel");
  pgVar1 = (ggml_tensor *)ggml_conv_transpose_1d(ctx,pgVar2,pgVar1,this->s0,this->p0,this->d0);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne_input.data());
        ggml_set_name(input, "input");

        ggml_tensor * kernel = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne_kernel.data());
        ggml_set_name(kernel, "kernel");

        ggml_tensor * out = ggml_conv_transpose_1d(ctx, kernel, input, s0, p0, d0);
        ggml_set_name(out, "out");

        return out;
    }